

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O2

void inxbuild(nn_quant *nnq)

{
  nq_pixel *paiVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int *piVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  
  piVar12 = nnq->network[1] + 2;
  uVar5 = 0;
  uVar11 = 1;
  iVar6 = 0;
  uVar7 = 0;
  while( true ) {
    lVar8 = (long)iVar6;
    if ((long)nnq->netsize <= (long)uVar5) break;
    paiVar1 = nnq->network + uVar5;
    iVar2 = nnq->network[uVar5][2];
    uVar15 = uVar5 & 0xffffffff;
    piVar13 = piVar12;
    iVar9 = iVar2;
    for (uVar10 = uVar11; (int)uVar10 < nnq->netsize; uVar10 = uVar10 + 1) {
      if (*piVar13 < iVar9) {
        uVar15 = (ulong)uVar10;
        iVar9 = *piVar13;
      }
      piVar13 = piVar13 + 5;
    }
    iVar14 = (int)uVar15;
    if (uVar5 != uVar15) {
      uVar3 = *(undefined8 *)nnq->network[iVar14];
      uVar4 = *(undefined8 *)(nnq->network[iVar14] + 2);
      *(undefined8 *)nnq->network[iVar14] = *(undefined8 *)*paiVar1;
      nnq->network[iVar14][2] = iVar2;
      iVar2 = nnq->network[iVar14][4];
      *(undefined8 *)(nnq->network[iVar14] + 3) = *(undefined8 *)(*paiVar1 + 3);
      *(undefined8 *)*paiVar1 = uVar3;
      *(undefined8 *)(*paiVar1 + 2) = uVar4;
      (*paiVar1)[4] = iVar2;
    }
    if (iVar9 != iVar6) {
      nnq->netindex[lVar8] = (int)uVar7 + (int)uVar5 >> 1;
      while (lVar8 + 1 < (long)iVar9) {
        nnq->netindex[lVar8 + 1] = (int)uVar5;
        lVar8 = lVar8 + 1;
      }
      uVar7 = uVar5 & 0xffffffff;
      iVar6 = iVar9;
    }
    uVar5 = uVar5 + 1;
    piVar12 = piVar12 + 5;
    uVar11 = uVar11 + 1;
  }
  iVar6 = (int)uVar7 + 0xff >> 1;
  lVar8 = lVar8 + -1;
  do {
    nnq->netindex[lVar8 + 1] = iVar6;
    lVar8 = lVar8 + 1;
    iVar6 = 0xff;
  } while (lVar8 < 0xff);
  return;
}

Assistant:

void inxbuild(nn_quant *nnq)
{
	register int i,j,smallpos,smallval;
	register int *p,*q;
	int previouscol,startpos;

	previouscol = 0;
	startpos = 0;
	for (i=0; i < nnq->netsize; i++) {
		p = nnq->network[i];
		smallpos = i;
		smallval = p[2];			/* index on g */
		/* find smallest in i..netsize-1 */
		for (j=i+1; j < nnq->netsize; j++) {
			q = nnq->network[j];
			if (q[2] < smallval) {		/* index on g */
				smallpos = j;
				smallval = q[2];	/* index on g */
			}
		}
		q = nnq->network[smallpos];
		/* swap p (i) and q (smallpos) entries */
		if (i != smallpos) {
			j = q[0];
			q[0] = p[0];
			p[0] = j;
			j = q[1];
			q[1] = p[1];
			p[1] = j;
			j = q[2];
			q[2] = p[2];
			p[2] = j;
			j = q[3];
			q[3] = p[3];
			p[3] = j;
			j = q[4];
			q[4] = p[4];
			p[4] = j;
		}
		/* smallval entry is now in position i */
		if (smallval != previouscol) {
			nnq->netindex[previouscol] = (startpos+i)>>1;
			for (j=previouscol+1; j<smallval; j++) nnq->netindex[j] = i;
			previouscol = smallval;
			startpos = i;
		}
	}
	nnq->netindex[previouscol] = (startpos+maxnetpos)>>1;
	for (j=previouscol+1; j<256; j++) nnq->netindex[j] = maxnetpos; /* really 256 */
}